

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::FCmpInst>::run(TypedDeleter<LLVMBC::FCmpInst> *this)

{
  TypedDeleter<LLVMBC::FCmpInst> *this_local;
  
  FCmpInst::~FCmpInst(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}